

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panning.cpp
# Opt level: O0

void aluInitRenderer(ALCdevice *device,int hrtf_id,HrtfRequestMode hrtf_appreq,
                    HrtfRequestMode hrtf_userreq)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  size_type sVar4;
  reference pvVar5;
  ulong uVar6;
  int *piVar7;
  char *pcVar8;
  int in_ECX;
  code *pcVar9;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  char *mode_1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> encopt;
  optional<int> cflevopt;
  HrtfStorePtr hrtf_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *hrtfname_1;
  iterator __end2;
  iterator __begin2;
  vector<std::string> *__range2;
  char *devname_2;
  HrtfStorePtr hrtf;
  string *hrtfname;
  char *devname_1;
  bool usehrtf;
  char *mode;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> modeopt
  ;
  bool headphones;
  BFormatDec *ambidec;
  bool hqdec;
  bool stablize;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> decopt;
  AmbDecConf conf;
  AmbDecConf *pconf;
  ALuint speakermap [16];
  char *devname;
  char *layout;
  HrtfStorePtr old_hrtf;
  char *in_stack_000006e0;
  AmbDecConf *in_stack_000006e8;
  ALuint in_stack_0000083c;
  char *in_stack_00000840;
  string *in_stack_00000848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  AmbDecConf *in_stack_fffffffffffffc60;
  pointer in_stack_fffffffffffffc68;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  ALCdevice *in_stack_fffffffffffffc80;
  ALuint (*in_stack_fffffffffffffc90) [16];
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  ALCdevice *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  bool local_34a;
  char *in_stack_fffffffffffffcb8;
  FILE *pFVar10;
  char *in_stack_fffffffffffffcc0;
  char *in_stack_fffffffffffffcc8;
  undefined4 *local_310;
  undefined4 *local_2f8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  optional<int> local_278;
  intrusive_ptr<HrtfStore> local_270;
  intrusive_ptr<HrtfStore> local_268;
  intrusive_ptr local_260 [8];
  reference local_258;
  pointer local_250;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
  local_248;
  pointer local_240;
  float local_238 [2];
  intrusive_ptr local_230 [8];
  reference local_228;
  pointer local_220;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  ALuint (*in_stack_fffffffffffffe18) [16];
  AmbDecConf *in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe2e;
  undefined1 in_stack_fffffffffffffe2f;
  ALCdevice *in_stack_fffffffffffffe30;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  byte local_19d;
  int local_19c;
  pointer local_198;
  undefined1 local_18e;
  bool local_18d;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  string local_130 [24];
  char *in_stack_fffffffffffffee8;
  vector<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_> vStack_f8;
  undefined4 local_e0 [4];
  undefined4 auStack_d0 [6];
  undefined4 local_b8 [4];
  undefined4 auStack_a8 [6];
  string *local_90;
  undefined8 local_40;
  char *local_38;
  intrusive_ptr<HrtfStore> local_30;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  intrusive_ptr<HrtfStore> in_stack_ffffffffffffffe0;
  
  al::intrusive_ptr<HrtfStore>::intrusive_ptr
            ((intrusive_ptr<HrtfStore> *)&stack0xffffffffffffffe0,
             (intrusive_ptr<HrtfStore> *)(in_RDI + 0x6e70));
  std::unique_ptr<DirectHrtfState,_std::default_delete<DirectHrtfState>_>::operator=
            ((unique_ptr<DirectHrtfState,_std::default_delete<DirectHrtfState>_> *)
             in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  al::intrusive_ptr<HrtfStore>::intrusive_ptr
            ((intrusive_ptr<HrtfStore> *)&stack0xffffffffffffffd8,(nullptr_t)0x0);
  al::intrusive_ptr<HrtfStore>::operator=
            ((intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc60,
             (intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc58);
  al::intrusive_ptr<HrtfStore>::~intrusive_ptr
            ((intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc60);
  std::__cxx11::string::clear();
  *(undefined4 *)(in_RDI + 0x168) = 0;
  if (*(char *)(in_RDI + 0x18) != '\x01') {
    al::intrusive_ptr<HrtfStore>::intrusive_ptr(&local_30,(nullptr_t)0x0);
    al::intrusive_ptr<HrtfStore>::operator=
              ((intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc60,
               (intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc58);
    al::intrusive_ptr<HrtfStore>::~intrusive_ptr
              ((intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc60);
    if (in_EDX == 1) {
      *(undefined4 *)(in_RDI + 0x88) = 5;
    }
    local_38 = (char *)0x0;
    switch(*(undefined1 *)(in_RDI + 0x18)) {
    case 0:
    case 1:
    case 6:
      break;
    case 2:
      local_38 = "quad";
      break;
    case 3:
    case 7:
      local_38 = "surround51";
      break;
    case 4:
      local_38 = "surround61";
      break;
    case 5:
      local_38 = "surround71";
    }
    local_40 = std::__cxx11::string::c_str();
    local_90 = (string *)0x0;
    std::__cxx11::string::string(local_130);
    memset(&vStack_f8,0,0x18);
    std::vector<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>::vector
              ((vector<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_> *)
               0x210920);
    local_2f8 = local_e0;
    do {
      *local_2f8 = 0;
      local_2f8 = local_2f8 + 1;
    } while (local_2f8 != auStack_d0);
    memset(auStack_d0,0,0x18);
    std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::vector
              ((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_> *)
               0x210998);
    local_310 = local_b8;
    do {
      *local_310 = 0;
      local_310 = local_310 + 1;
    } while (local_310 != auStack_a8);
    memset(auStack_a8,0,0x18);
    std::vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>::vector
              ((vector<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_> *)
               0x210a13);
    if (local_38 != (char *)0x0) {
      ConfigValueStr_abi_cxx11_
                (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::optional<true,_true>
                (in_stack_fffffffffffffc70,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffc68);
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffc60);
      bVar1 = al::optional::operator_cast_to_bool((optional *)&local_158);
      if (bVar1) {
        al::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator->(&local_158);
        std::__cxx11::string::c_str();
        iVar2 = AmbDecConf::load(in_stack_000006e8,in_stack_000006e0);
        if (iVar2 == 0) {
          if (0 < (int)gLogLevel) {
            pFVar10 = (FILE *)gLogFile;
            al::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator->(&local_158);
            uVar3 = std::__cxx11::string::c_str();
            fprintf(pFVar10,"[ALSOFT] (EE) Failed to load layout file %s\n",uVar3);
          }
        }
        else {
          sVar4 = std::vector<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                  ::size(&vStack_f8);
          if (sVar4 < 0x11) {
            bVar1 = anon_unknown.dwarf_1cab89::MakeSpeakerMap
                              (in_stack_fffffffffffffca0,
                               (AmbDecConf *)
                               CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
                               in_stack_fffffffffffffc90);
            if (bVar1) {
              local_90 = local_130;
            }
          }
          else if (0 < (int)gLogLevel) {
            pFVar10 = (FILE *)gLogFile;
            sVar4 = std::
                    vector<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>::
                    size(&vStack_f8);
            fprintf(pFVar10,"[ALSOFT] (EE) Unsupported speaker count %zu (max %d)\n",sVar4,0x10);
          }
        }
      }
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffc60);
    }
    pvVar5 = std::array<unsigned_int,_16UL>::operator[]
                       ((array<unsigned_int,_16UL> *)in_stack_fffffffffffffc60,
                        (size_type)in_stack_fffffffffffffc58);
    local_34a = false;
    if (*pvVar5 != 0xffffffff) {
      pvVar5 = std::array<unsigned_int,_16UL>::operator[]
                         ((array<unsigned_int,_16UL> *)in_stack_fffffffffffffc60,
                          (size_type)in_stack_fffffffffffffc58);
      local_34a = false;
      if (*pvVar5 != 0xffffffff) {
        pvVar5 = std::array<unsigned_int,_16UL>::operator[]
                           ((array<unsigned_int,_16UL> *)in_stack_fffffffffffffc60,
                            (size_type)in_stack_fffffffffffffc58);
        local_34a = false;
        if (*pvVar5 != 0xffffffff) {
          iVar2 = GetConfigValueBool(in_stack_fffffffffffffc78,&in_stack_fffffffffffffc70->mHasValue
                                     ,(char *)in_stack_fffffffffffffc68,
                                     (int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
          local_34a = iVar2 != 0;
        }
      }
    }
    local_18d = local_34a;
    iVar2 = GetConfigValueBool(in_stack_fffffffffffffc78,&in_stack_fffffffffffffc70->mHasValue,
                               (char *)in_stack_fffffffffffffc68,
                               (int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
    local_18e = iVar2 != 0;
    if (local_90 == (string *)0x0) {
      anon_unknown.dwarf_1cab89::InitPanning
                ((ALCdevice *)in_stack_ffffffffffffffe0.mPtr,(bool)in_stack_ffffffffffffffdf,
                 (bool)in_stack_ffffffffffffffde);
    }
    else {
      anon_unknown.dwarf_1cab89::InitCustomPanning
                (in_stack_fffffffffffffe30,(bool)in_stack_fffffffffffffe2f,
                 (bool)in_stack_fffffffffffffe2e,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18
                );
    }
    local_198 = std::unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_>::get
                          ((unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_> *)
                           in_stack_fffffffffffffc60);
    if (local_198 != (pointer)0x0) {
      bVar1 = BFormatDec::hasStablizer((BFormatDec *)0x210e31);
      pcVar9 = ALCdevice::ProcessAmbiDec;
      if (bVar1) {
        pcVar9 = ALCdevice::ProcessAmbiDecStablized;
      }
      *(code **)(in_RDI + 0x6e90) = pcVar9;
      *(undefined8 *)(in_RDI + 0x6e98) = 0;
    }
    local_19c = 1;
    AmbDecConf::~AmbDecConf(in_stack_fffffffffffffc60);
    goto LAB_002119e6;
  }
  local_19d = *(byte *)(in_RDI + 0x1a) & 1;
  if (*(int *)(in_RDI + 8) != 2) {
    std::__cxx11::string::c_str();
    ConfigValueStr_abi_cxx11_
              (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional<true,_true>
              (in_stack_fffffffffffffc70,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffc68);
    al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffc60);
    bVar1 = al::optional::operator_cast_to_bool((optional *)&local_1c8);
    if (bVar1) {
      in_stack_fffffffffffffca0 =
           (ALCdevice *)
           al::
           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator->(&local_1c8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      iVar2 = al::strcasecmp(pcVar8,"headphones");
      if (iVar2 == 0) {
        local_19d = 1;
      }
      else {
        iVar2 = al::strcasecmp(pcVar8,"speakers");
        if (iVar2 == 0) {
          local_19d = 0;
        }
        else {
          iVar2 = al::strcasecmp(pcVar8,"auto");
          if ((iVar2 != 0) && (0 < (int)gLogLevel)) {
            fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected stereo-mode: %s\n",pcVar8);
          }
        }
      }
    }
    al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffc60);
  }
  if (in_ECX == 0) {
    if (((local_19d & 1) == 0) || (in_stack_fffffffffffffc9f = true, in_EDX == 2)) {
      in_stack_fffffffffffffc9f = in_EDX == 1;
    }
    if ((bool)in_stack_fffffffffffffc9f != false) {
      *(undefined4 *)(in_RDI + 0x88) = 1;
      in_stack_fffffffffffffe07 = in_stack_fffffffffffffc9f;
      if (((local_19d & 1) != 0) && (in_EDX != 2)) {
        *(undefined4 *)(in_RDI + 0x88) = 4;
      }
LAB_00211123:
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                       *)in_stack_fffffffffffffc70);
      if (bVar1) {
        std::__cxx11::string::c_str();
        EnumerateHrtf_abi_cxx11_(in_stack_fffffffffffffee8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                     *)in_stack_fffffffffffffc70,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                     *)in_stack_fffffffffffffc68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                   *)in_stack_fffffffffffffc70);
      }
      if (-1 < (int)in_ESI) {
        uVar6 = (ulong)in_ESI;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                        *)(in_RDI + 0x70));
        if (uVar6 < sVar4) {
          local_220 = (pointer)std::__cxx11::string::c_str();
          local_228 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                                    *)(in_RDI + 0x70),(ulong)in_ESI);
          GetLoadedHrtf(in_stack_00000848,in_stack_00000840,in_stack_0000083c);
          bVar1 = al::intrusive_ptr::operator_cast_to_bool(local_230);
          if (bVar1) {
            al::intrusive_ptr<HrtfStore>::operator=
                      ((intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc60,
                       (intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc58);
            std::__cxx11::string::operator=((string *)(in_RDI + 0x50),(string *)local_228);
          }
          al::intrusive_ptr<HrtfStore>::~intrusive_ptr
                    ((intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc60);
        }
      }
      bVar1 = al::intrusive_ptr::operator_cast_to_bool((intrusive_ptr *)(in_RDI + 0x6e70));
      if (!bVar1) {
        local_238 = (float  [2])std::__cxx11::string::c_str();
        local_240 = (pointer)(in_RDI + 0x70);
        local_248._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
             ::begin(in_stack_fffffffffffffc58);
        local_250 = (pointer)std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                                    *)in_stack_fffffffffffffc58);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
                                   *)in_stack_fffffffffffffc60,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
                                   *)in_stack_fffffffffffffc58), bVar1) {
          local_258 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
                      ::operator*(&local_248);
          GetLoadedHrtf(in_stack_00000848,in_stack_00000840,in_stack_0000083c);
          bVar1 = al::intrusive_ptr::operator_cast_to_bool(local_260);
          if (bVar1) {
            al::intrusive_ptr<HrtfStore>::operator=
                      ((intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc60,
                       (intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc58);
            std::__cxx11::string::operator=((string *)(in_RDI + 0x50),(string *)local_258);
            local_19c = 0xc;
          }
          else {
            local_19c = 0;
          }
          al::intrusive_ptr<HrtfStore>::~intrusive_ptr
                    ((intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc60);
          if (local_19c != 0) break;
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
          ::operator++(&local_248);
        }
      }
      bVar1 = al::intrusive_ptr::operator_cast_to_bool((intrusive_ptr *)(in_RDI + 0x6e70));
      if (bVar1) {
        al::intrusive_ptr<HrtfStore>::intrusive_ptr(&local_268,(nullptr_t)0x0);
        al::intrusive_ptr<HrtfStore>::operator=
                  ((intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc60,
                   (intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc58);
        al::intrusive_ptr<HrtfStore>::~intrusive_ptr
                  ((intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc60);
        anon_unknown.dwarf_1cab89::InitHrtfPanning
                  ((ALCdevice *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
        *(code **)(in_RDI + 0x6e90) = ALCdevice::ProcessHrtf;
        *(undefined8 *)(in_RDI + 0x6e98) = 0;
        local_19c = 1;
        goto LAB_002119e6;
      }
      *(undefined4 *)(in_RDI + 0x88) = 5;
    }
  }
  else {
    if (in_ECX == 1) {
      *(undefined4 *)(in_RDI + 0x88) = 3;
      goto LAB_00211123;
    }
    if (in_EDX == 1) {
      *(undefined4 *)(in_RDI + 0x88) = 2;
    }
  }
  al::intrusive_ptr<HrtfStore>::intrusive_ptr(&local_270,(nullptr_t)0x0);
  al::intrusive_ptr<HrtfStore>::operator=
            ((intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc60,
             (intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc58);
  al::intrusive_ptr<HrtfStore>::~intrusive_ptr
            ((intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc60);
  *(undefined4 *)(in_RDI + 0x168) = 1;
  if (*(int *)(in_RDI + 8) != 2) {
    std::__cxx11::string::c_str();
    ConfigValueInt((char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                   (char *)in_stack_fffffffffffffca0,
                   (char *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98));
    al::optional<int>::optional<true,_true>
              ((optional<int> *)in_stack_fffffffffffffc70,(optional<int> *)in_stack_fffffffffffffc68
              );
    al::optional<int>::~optional((optional<int> *)in_stack_fffffffffffffc60);
    bVar1 = al::optional::operator_cast_to_bool((optional *)&local_278);
    if (((bVar1) &&
        (in_stack_fffffffffffffc80 = (ALCdevice *)al::optional<int>::operator*(&local_278),
        0 < (int)(in_stack_fffffffffffffc80->super_intrusive_ref<ALCdevice>).mRef.
                 super___atomic_base<unsigned_int>._M_i)) &&
       (piVar7 = al::optional<int>::operator*(&local_278), *piVar7 < 7)) {
      std::make_unique<bs2b>();
      in_stack_fffffffffffffc60 = (AmbDecConf *)&stack0xfffffffffffffd78;
      std::unique_ptr<bs2b,_std::default_delete<bs2b>_>::operator=
                ((unique_ptr<bs2b,_std::default_delete<bs2b>_> *)in_stack_fffffffffffffc60,
                 (unique_ptr<bs2b,_std::default_delete<bs2b>_> *)in_stack_fffffffffffffc58);
      std::unique_ptr<bs2b,_std::default_delete<bs2b>_>::~unique_ptr
                ((unique_ptr<bs2b,_std::default_delete<bs2b>_> *)in_stack_fffffffffffffc60);
      in_stack_fffffffffffffc68 =
           std::unique_ptr<bs2b,_std::default_delete<bs2b>_>::get
                     ((unique_ptr<bs2b,_std::default_delete<bs2b>_> *)in_stack_fffffffffffffc60);
      in_stack_fffffffffffffc70 =
           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)al::optional<int>::operator*(&local_278);
      bs2b_set_params((bs2b *)in_stack_fffffffffffffc60,
                      (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),(int)in_stack_fffffffffffffc58
                     );
      if (2 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (II) BS2B enabled\n");
      }
      anon_unknown.dwarf_1cab89::InitPanning
                ((ALCdevice *)in_stack_ffffffffffffffe0.mPtr,(bool)in_stack_ffffffffffffffdf,
                 (bool)in_stack_ffffffffffffffde);
      *(code **)(in_RDI + 0x6e90) = ALCdevice::ProcessBs2b;
      *(undefined8 *)(in_RDI + 0x6e98) = 0;
      local_19c = 1;
    }
    else {
      local_19c = 0;
    }
    al::optional<int>::~optional((optional<int> *)in_stack_fffffffffffffc60);
    if (local_19c != 0) goto LAB_002119e6;
  }
  std::__cxx11::string::c_str();
  ConfigValueStr_abi_cxx11_
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<true,_true>
            (in_stack_fffffffffffffc70,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffc68);
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffc60);
  bVar1 = al::optional::operator_cast_to_bool((optional *)&local_2b0);
  if (bVar1) {
    in_stack_fffffffffffffc58 =
         al::
         optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator->(&local_2b0);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    iVar2 = al::strcasecmp(pcVar8,"uhj");
    if (iVar2 == 0) {
      *(undefined4 *)(in_RDI + 0x168) = 0;
    }
    else {
      iVar2 = al::strcasecmp(pcVar8,"panpot");
      if ((iVar2 != 0) && (0 < (int)gLogLevel)) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected stereo-encoding: %s\n",pcVar8);
      }
    }
  }
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffc60);
  if (*(int *)(in_RDI + 0x168) == 0) {
    std::make_unique<Uhj2Encoder>();
    std::unique_ptr<Uhj2Encoder,_std::default_delete<Uhj2Encoder>_>::operator=
              ((unique_ptr<Uhj2Encoder,_std::default_delete<Uhj2Encoder>_> *)
               in_stack_fffffffffffffc60,
               (unique_ptr<Uhj2Encoder,_std::default_delete<Uhj2Encoder>_> *)
               in_stack_fffffffffffffc58);
    std::unique_ptr<Uhj2Encoder,_std::default_delete<Uhj2Encoder>_>::~unique_ptr
              ((unique_ptr<Uhj2Encoder,_std::default_delete<Uhj2Encoder>_> *)
               in_stack_fffffffffffffc60);
    if (2 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (II) UHJ enabled\n");
    }
    anon_unknown.dwarf_1cab89::InitUhjPanning(in_stack_fffffffffffffc80);
    *(code **)(in_RDI + 0x6e90) = ALCdevice::ProcessUhj;
    *(undefined8 *)(in_RDI + 0x6e98) = 0;
    local_19c = 1;
  }
  else {
    if (2 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (II) Stereo rendering\n");
    }
    anon_unknown.dwarf_1cab89::InitPanning
              ((ALCdevice *)in_stack_ffffffffffffffe0.mPtr,(bool)in_stack_ffffffffffffffdf,
               (bool)in_stack_ffffffffffffffde);
    *(code **)(in_RDI + 0x6e90) = ALCdevice::ProcessAmbiDec;
    *(undefined8 *)(in_RDI + 0x6e98) = 0;
    local_19c = 0;
  }
LAB_002119e6:
  al::intrusive_ptr<HrtfStore>::~intrusive_ptr
            ((intrusive_ptr<HrtfStore> *)in_stack_fffffffffffffc60);
  return;
}

Assistant:

void aluInitRenderer(ALCdevice *device, int hrtf_id, HrtfRequestMode hrtf_appreq,
    HrtfRequestMode hrtf_userreq)
{
    /* Hold the HRTF the device last used, in case it's used again. */
    HrtfStorePtr old_hrtf{std::move(device->mHrtf)};

    device->mHrtfState = nullptr;
    device->mHrtf = nullptr;
    device->HrtfName.clear();
    device->mRenderMode = RenderMode::Normal;

    if(device->FmtChans != DevFmtStereo)
    {
        old_hrtf = nullptr;
        if(hrtf_appreq == Hrtf_Enable)
            device->HrtfStatus = ALC_HRTF_UNSUPPORTED_FORMAT_SOFT;

        const char *layout{nullptr};
        switch(device->FmtChans)
        {
            case DevFmtQuad: layout = "quad"; break;
            case DevFmtX51: /* fall-through */
            case DevFmtX51Rear: layout = "surround51"; break;
            case DevFmtX61: layout = "surround61"; break;
            case DevFmtX71: layout = "surround71"; break;
            /* Mono, Stereo, and Ambisonics output don't use custom decoders. */
            case DevFmtMono:
            case DevFmtStereo:
            case DevFmtAmbi3D:
                break;
        }

        const char *devname{device->DeviceName.c_str()};
        ALuint speakermap[MAX_OUTPUT_CHANNELS];
        AmbDecConf *pconf{nullptr};
        AmbDecConf conf{};
        if(layout)
        {
            if(auto decopt = ConfigValueStr(devname, "decoder", layout))
            {
                if(!conf.load(decopt->c_str()))
                    ERR("Failed to load layout file %s\n", decopt->c_str());
                else if(conf.Speakers.size() > MAX_OUTPUT_CHANNELS)
                    ERR("Unsupported speaker count %zu (max %d)\n", conf.Speakers.size(),
                        MAX_OUTPUT_CHANNELS);
                else if(conf.ChanMask > AMBI_3ORDER_MASK)
                    ERR("Unsupported channel mask 0x%04x (max 0x%x)\n", conf.ChanMask,
                        AMBI_3ORDER_MASK);
                else if(MakeSpeakerMap(device, &conf, speakermap))
                    pconf = &conf;
            }
        }

        /* Enable the stablizer only for formats that have front-left, front-
         * right, and front-center outputs.
         */
        const bool stablize{device->RealOut.ChannelIndex[FrontCenter] != INVALID_CHANNEL_INDEX
            && device->RealOut.ChannelIndex[FrontLeft] != INVALID_CHANNEL_INDEX
            && device->RealOut.ChannelIndex[FrontRight] != INVALID_CHANNEL_INDEX
            && GetConfigValueBool(devname, nullptr, "front-stablizer", 0) != 0};
        const bool hqdec{GetConfigValueBool(devname, "decoder", "hq-mode", 1) != 0};
        if(!pconf)
            InitPanning(device, hqdec, stablize);
        else
            InitCustomPanning(device, hqdec, stablize, pconf, speakermap);
        if(auto *ambidec{device->AmbiDecoder.get()})
        {
            device->PostProcess = ambidec->hasStablizer() ? &ALCdevice::ProcessAmbiDecStablized
                : &ALCdevice::ProcessAmbiDec;
        }
        return;
    }

    bool headphones{device->IsHeadphones};
    if(device->Type != DeviceType::Loopback)
    {
        if(auto modeopt = ConfigValueStr(device->DeviceName.c_str(), nullptr, "stereo-mode"))
        {
            const char *mode{modeopt->c_str()};
            if(al::strcasecmp(mode, "headphones") == 0)
                headphones = true;
            else if(al::strcasecmp(mode, "speakers") == 0)
                headphones = false;
            else if(al::strcasecmp(mode, "auto") != 0)
                ERR("Unexpected stereo-mode: %s\n", mode);
        }
    }

    if(hrtf_userreq == Hrtf_Default)
    {
        bool usehrtf = (headphones && hrtf_appreq != Hrtf_Disable) ||
                       (hrtf_appreq == Hrtf_Enable);
        if(!usehrtf) goto no_hrtf;

        device->HrtfStatus = ALC_HRTF_ENABLED_SOFT;
        if(headphones && hrtf_appreq != Hrtf_Disable)
            device->HrtfStatus = ALC_HRTF_HEADPHONES_DETECTED_SOFT;
    }
    else
    {
        if(hrtf_userreq != Hrtf_Enable)
        {
            if(hrtf_appreq == Hrtf_Enable)
                device->HrtfStatus = ALC_HRTF_DENIED_SOFT;
            goto no_hrtf;
        }
        device->HrtfStatus = ALC_HRTF_REQUIRED_SOFT;
    }

    if(device->HrtfList.empty())
        device->HrtfList = EnumerateHrtf(device->DeviceName.c_str());

    if(hrtf_id >= 0 && static_cast<ALuint>(hrtf_id) < device->HrtfList.size())
    {
        const char *devname{device->DeviceName.c_str()};
        const std::string &hrtfname = device->HrtfList[static_cast<ALuint>(hrtf_id)];
        if(HrtfStorePtr hrtf{GetLoadedHrtf(hrtfname, devname, device->Frequency)})
        {
            device->mHrtf = std::move(hrtf);
            device->HrtfName = hrtfname;
        }
    }

    if(!device->mHrtf)
    {
        const char *devname{device->DeviceName.c_str()};
        for(const auto &hrtfname : device->HrtfList)
        {
            if(HrtfStorePtr hrtf{GetLoadedHrtf(hrtfname, devname, device->Frequency)})
            {
                device->mHrtf = std::move(hrtf);
                device->HrtfName = hrtfname;
                break;
            }
        }
    }

    if(device->mHrtf)
    {
        old_hrtf = nullptr;

        InitHrtfPanning(device);
        device->PostProcess = &ALCdevice::ProcessHrtf;
        return;
    }
    device->HrtfStatus = ALC_HRTF_UNSUPPORTED_FORMAT_SOFT;

no_hrtf:
    old_hrtf = nullptr;

    device->mRenderMode = RenderMode::Pairwise;

    if(device->Type != DeviceType::Loopback)
    {
        if(auto cflevopt = ConfigValueInt(device->DeviceName.c_str(), nullptr, "cf_level"))
        {
            if(*cflevopt > 0 && *cflevopt <= 6)
            {
                device->Bs2b = std::make_unique<bs2b>();
                bs2b_set_params(device->Bs2b.get(), *cflevopt,
                    static_cast<int>(device->Frequency));
                TRACE("BS2B enabled\n");
                InitPanning(device);
                device->PostProcess = &ALCdevice::ProcessBs2b;
                return;
            }
        }
    }

    if(auto encopt = ConfigValueStr(device->DeviceName.c_str(), nullptr, "stereo-encoding"))
    {
        const char *mode{encopt->c_str()};
        if(al::strcasecmp(mode, "uhj") == 0)
            device->mRenderMode = RenderMode::Normal;
        else if(al::strcasecmp(mode, "panpot") != 0)
            ERR("Unexpected stereo-encoding: %s\n", mode);
    }
    if(device->mRenderMode == RenderMode::Normal)
    {
        device->Uhj_Encoder = std::make_unique<Uhj2Encoder>();
        TRACE("UHJ enabled\n");
        InitUhjPanning(device);
        device->PostProcess = &ALCdevice::ProcessUhj;
        return;
    }

    TRACE("Stereo rendering\n");
    InitPanning(device);
    device->PostProcess = &ALCdevice::ProcessAmbiDec;
}